

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

bool __thiscall mkvparser::Chapters::ExpandEditionsArray(Chapters *this)

{
  int iVar1;
  uint uVar2;
  Edition *pEVar3;
  long *plVar4;
  long lVar5;
  ulong uVar6;
  Edition *pEVar7;
  int iVar8;
  bool bVar9;
  
  iVar1 = this->m_editions_size;
  uVar2 = this->m_editions_count;
  bVar9 = true;
  if (iVar1 <= (int)uVar2) {
    iVar8 = 1;
    if (iVar1 != 0) {
      iVar8 = iVar1 * 2;
    }
    uVar6 = 0xffffffffffffffff;
    if (-1 < iVar8) {
      uVar6 = (long)iVar8 << 4 | 8;
    }
    plVar4 = (long *)operator_new__(uVar6,(nothrow_t *)&std::nothrow);
    if (plVar4 == (long *)0x0) {
      pEVar7 = (Edition *)0x0;
    }
    else {
      *plVar4 = (long)iVar8;
      pEVar7 = (Edition *)(plVar4 + 1);
    }
    bVar9 = pEVar7 != (Edition *)0x0;
    if (bVar9) {
      if (0 < (int)uVar2) {
        pEVar3 = this->m_editions;
        lVar5 = 0;
        do {
          *(undefined8 *)((long)&pEVar7->m_atoms + lVar5) =
               *(undefined8 *)((long)&pEVar3->m_atoms + lVar5);
          *(undefined4 *)((long)&pEVar7->m_atoms_size + lVar5) =
               *(undefined4 *)((long)&pEVar3->m_atoms_size + lVar5);
          *(undefined4 *)((long)&pEVar7->m_atoms_count + lVar5) =
               *(undefined4 *)((long)&pEVar3->m_atoms_count + lVar5);
          lVar5 = lVar5 + 0x10;
        } while ((ulong)uVar2 << 4 != lVar5);
      }
      if (this->m_editions != (Edition *)0x0) {
        operator_delete__(&this->m_editions[-1].m_atoms_size);
      }
      this->m_editions = pEVar7;
      this->m_editions_size = iVar8;
    }
  }
  return bVar9;
}

Assistant:

bool Chapters::ExpandEditionsArray() {
  if (m_editions_size > m_editions_count)
    return true;  // nothing else to do

  const int size = (m_editions_size == 0) ? 1 : 2 * m_editions_size;

  Edition* const editions = new (std::nothrow) Edition[size];

  if (editions == NULL)
    return false;

  for (int idx = 0; idx < m_editions_count; ++idx) {
    m_editions[idx].ShallowCopy(editions[idx]);
  }

  delete[] m_editions;
  m_editions = editions;

  m_editions_size = size;
  return true;
}